

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O2

int dasm_getpclabel(BuildCtx *ctx,uint pc)

{
  int iVar1;
  dasm_State *pdVar2;
  
  pdVar2 = ctx->D;
  if ((ulong)pc * 4 < pdVar2->pcsize) {
    iVar1 = pdVar2->pclabels[pc];
    if (iVar1 < 0) {
      return pdVar2->sections[(uint)-iVar1 >> 0x18].rbuf[(uint)-iVar1];
    }
    if (iVar1 != 0) {
      return -1;
    }
  }
  return -2;
}

Assistant:

int dasm_getpclabel(Dst_DECL, unsigned int pc)
{
  dasm_State *D = Dst_REF;
  if (pc*sizeof(int) < D->pcsize) {
    int pos = D->pclabels[pc];
    if (pos < 0) return *DASM_POS2PTR(D, -pos);
    if (pos > 0) return -1;  /* Undefined. */
  }
  return -2;  /* Unused or out of range. */
}